

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testConstructWithHandler_Test::Engine_testConstructWithHandler_Test
          (Engine_testConstructWithHandler_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__Engine_testConstructWithHandler_Test_00276f40;
  return;
}

Assistant:

TEST(Engine, testConstructWithHandler) {
    Engine e("foo", std::move(std::make_unique<TestHandler>()));
    ASSERT_EQ("foo", e.prefix);
    ASSERT_EQ(1, e.GetHandlers().size());
    ASSERT_NE(nullptr, dynamic_cast<TestHandler *>(e.GetHandlers()[0].get()));
    Engine e1(std::string("foo"), std::move(std::make_unique<TestHandler>()));
    ASSERT_EQ("foo", e1.prefix);
    ASSERT_EQ(1, e1.GetHandlers().size());
    ASSERT_NE(nullptr, dynamic_cast<TestHandler *>(e1.GetHandlers()[0].get()));
}